

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O3

bool __thiscall ON_Brep::Read(ON_Brep *this,ON_BinaryArchive *file)

{
  double *pdVar1;
  ON_BrepEdge *pOVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepLoop *pOVar4;
  ON_BrepFace *pOVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  ON_Mesh *pOVar17;
  undefined7 extraout_var_02;
  ON_BrepRegionTopology *pOVar18;
  ON_BoundingBox *pOVar19;
  ON_BoundingBox *pOVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ON_CurveProxy *pOVar24;
  bool bVar25;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ON_Interval OVar30;
  ON_Interval domain;
  ON_Interval real_curve_subdomain;
  ON_Interval domain_00;
  int minor_version;
  ON_Object *obj;
  bool bReadRegionTopology;
  int major_version;
  uchar b;
  ON_BoundingBox new_brep_bbox;
  ON_BoundingBox archive_brep_bbox;
  int local_1cc;
  ON_BoundingBox *local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  int local_1a8;
  int local_1a4;
  ON_Brep *local_1a0;
  ON_BoundingBox local_198;
  ON_BoundingBox local_168;
  double local_138;
  int local_12c;
  ON_BoundingBox local_128;
  ON_BoundingBox local_f8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double dVar27;
  
  local_12c = 0;
  local_1cc = 0;
  bVar11 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_12c,&local_1cc);
  uVar22 = CONCAT71(extraout_var,bVar11) & 0xffffffff;
  if ((local_12c == 2 & (byte)uVar22) == 1) {
    bVar11 = ReadOld200(this,file,local_1cc);
    uVar22 = CONCAT71(extraout_var_00,bVar11) & 0xffffffff;
    goto LAB_004060f8;
  }
  if ((local_12c == 3 & (byte)uVar22) != 1) goto LAB_004060f8;
  bVar11 = ON_CurveArray::Read(&this->m_C2,file);
  if (bVar11) {
    iVar16 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
    bVar11 = ON_CurveArray::Read(&this->m_C3,file);
    if (!bVar11) goto LAB_00405dec;
    local_1c0 = (double)CONCAT44(local_1c0._4_4_,
                                 (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count);
    bVar11 = ON_SurfaceArray::Read(&this->m_S,file);
    if (!bVar11) goto LAB_00405dec;
    iVar14 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
    bVar11 = ON_BrepVertexArray::Read(&this->m_V,file);
    if ((!bVar11) || (bVar11 = ON_BrepEdgeArray::Read(&this->m_E,file), !bVar11)) goto LAB_00405dec;
    iVar13 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
    local_1a8 = iVar14;
    local_1a4 = iVar16;
    local_1a0 = this;
    if (0 < iVar13) {
      lVar23 = 0;
      lVar21 = 0;
      do {
        pOVar2 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        *(ON_Brep **)((long)pOVar2->m_vi + lVar23 + 0x2c) = this;
        iVar16 = *(int *)((long)pOVar2->m_vi + lVar23 + -4);
        if ((-1 < iVar16) && (iVar16 < local_1c0._0_4_)) {
          pOVar24 = (ON_CurveProxy *)
                    ((long)&(((ON_CurveProxy *)
                             (&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -2))->
                            super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
                    lVar23);
          bVar11 = ON_CurveProxy::ProxyCurveIsReversed(pOVar24);
          OVar30 = ON_CurveProxy::ProxyCurveDomain(pOVar24);
          dVar27 = OVar30.m_t[1];
          local_1b8 = OVar30.m_t[0];
          local_138 = dVar27;
          (*(pOVar24->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                    (pOVar24);
          OVar30.m_t[1] = local_138;
          OVar30.m_t[0] = local_1b8;
          local_1c8 = (ON_BoundingBox *)extraout_XMM0_Qa;
          local_1b0 = dVar27;
          ON_CurveProxy::SetProxyCurve
                    (pOVar24,(this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a
                             [*(int *)&pOVar24[1].m_real_curve],OVar30);
          if (bVar11) {
            ON_CurveProxy::Reverse(pOVar24);
          }
          domain.m_t[1] = local_1b0;
          domain.m_t[0] = (double)local_1c8;
          ON_CurveProxy::SetDomain(pOVar24,domain);
          iVar13 = (local_1a0->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                   super_ON_ClassArray<ON_BrepEdge>.m_count;
          this = local_1a0;
        }
        lVar21 = lVar21 + 1;
        lVar23 = lVar23 + 0x88;
      } while (lVar21 < iVar13);
    }
    bVar11 = ON_BrepTrimArray::Read(&this->m_T,file);
    if (!bVar11) goto LAB_00405dec;
    iVar16 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
    if (0 < iVar16) {
      lVar23 = 0;
      lVar21 = 0;
      do {
        pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        *(ON_Brep **)((long)pOVar3->m_tolerance + lVar23 + 0x70) = this;
        iVar14 = *(int *)((long)pOVar3->m_vi + lVar23 + -8);
        if ((-1 < iVar14) && (iVar14 < local_1a4)) {
          pOVar24 = (ON_CurveProxy *)
                    ((long)&(((ON_CurveProxy *)
                             (&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2))->
                            super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
                    lVar23);
          bVar11 = ON_CurveProxy::ProxyCurveIsReversed(pOVar24);
          OVar30 = ON_CurveProxy::ProxyCurveDomain(pOVar24);
          dVar27 = OVar30.m_t[1];
          local_1b0 = OVar30.m_t[0];
          local_1b8 = dVar27;
          (*(pOVar24->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                    (pOVar24);
          real_curve_subdomain.m_t[1] = local_1b8;
          real_curve_subdomain.m_t[0] = local_1b0;
          local_1c8 = (ON_BoundingBox *)dVar27;
          local_1c0 = extraout_XMM0_Qa_00;
          ON_CurveProxy::SetProxyCurve
                    (pOVar24,(this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a
                             [*(int *)&pOVar24[1].m_real_curve],real_curve_subdomain);
          if (bVar11) {
            ON_CurveProxy::Reverse(pOVar24);
          }
          domain_00.m_t[1] = (double)local_1c8;
          domain_00.m_t[0] = local_1c0;
          ON_CurveProxy::SetDomain(pOVar24,domain_00);
          iVar16 = (local_1a0->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                   super_ON_ClassArray<ON_BrepTrim>.m_count;
          this = local_1a0;
        }
        lVar21 = lVar21 + 1;
        lVar23 = lVar23 + 0xe8;
      } while (lVar21 < iVar16);
    }
    bVar11 = ON_BrepLoopArray::Read(&this->m_L,file);
    iVar16 = local_1a8;
    auVar10 = _DAT_0069b120;
    if (!bVar11) goto LAB_00405dec;
    iVar14 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
    if (0 < (long)iVar14) {
      pOVar4 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
      lVar23 = (long)iVar14 + -1;
      auVar26._8_4_ = (int)lVar23;
      auVar26._0_8_ = lVar23;
      auVar26._12_4_ = (int)((ulong)lVar23 >> 0x20);
      lVar23 = 0;
      auVar26 = auVar26 ^ _DAT_0069b120;
      auVar28 = _DAT_0069b170;
      do {
        auVar29 = auVar28 ^ auVar10;
        if ((bool)(~(auVar29._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar29._0_4_ ||
                    auVar26._4_4_ < auVar29._4_4_) & 1)) {
          *(ON_Brep **)((long)&pOVar4->m_brep + lVar23) = this;
        }
        if ((auVar29._12_4_ != auVar26._12_4_ || auVar29._8_4_ <= auVar26._8_4_) &&
            auVar29._12_4_ <= auVar26._12_4_) {
          *(ON_Brep **)((long)&pOVar4[1].m_brep + lVar23) = this;
        }
        lVar21 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 2;
        auVar28._8_8_ = lVar21 + 2;
        lVar23 = lVar23 + 0xf0;
      } while ((ulong)(iVar14 + 1U >> 1) * 0xf0 - lVar23 != 0);
    }
    bVar11 = ON_BrepFaceArray::Read(&this->m_F,file);
    if (!bVar11) goto LAB_00405dec;
    iVar14 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
    if (0 < iVar14) {
      lVar23 = 0;
      lVar21 = 0;
      do {
        pOVar5 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
        *(ON_Brep **)((long)(&pOVar5->m_face_uuid + 7) + lVar23 + 0xc) = this;
        iVar13 = *(int *)((pOVar5->m_face_uuid).Data4 + lVar23 + -0x14);
        if ((-1 < (long)iVar13) && (iVar13 < iVar16)) {
          ON_SurfaceProxy::SetProxySurface
                    ((ON_SurfaceProxy *)((pOVar5->m_face_uuid).Data4 + lVar23 + -0x5c),
                     (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[iVar13]);
          iVar14 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                   m_count;
        }
        lVar21 = lVar21 + 1;
        lVar23 = lVar23 + 0xd8;
      } while (lVar21 < iVar14);
    }
    bVar11 = ON_BinaryArchive::ReadPoint(file,&(this->m_bbox).m_min);
    if (!bVar11) goto LAB_00405dec;
    bVar11 = ON_BinaryArchive::ReadPoint(file,&(this->m_bbox).m_max);
    uVar22 = CONCAT71(extraout_var_01,bVar11) & 0xffffffff;
  }
  else {
LAB_00405dec:
    uVar22 = 0;
  }
  ReadFillInMissingBoxes(this);
  if ((0 < local_1cc & (byte)uVar22) == 1) {
    uVar15 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
    local_f8.m_min.x = (double)((ulong)local_f8.m_min.x & 0xffffffff00000000);
    local_168.m_min.x = 0.0;
    bVar11 = ON_BinaryArchive::BeginRead3dmBigChunk(file,(uint *)&local_f8,(ON__INT64 *)&local_168);
    if (bVar11) {
      bVar11 = false;
      if (local_f8.m_min.x._0_4_ == 0x40008000) {
        if ((int)uVar15 < 1) {
          bVar11 = true;
        }
        else {
          lVar23 = 0;
          uVar22 = 1;
          do {
            bVar11 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_128);
            if ((bVar11) && (local_128.m_min.x._0_1_ != '\0')) {
              local_198.m_min.x = 0.0;
              iVar16 = ON_BinaryArchive::ReadObject(file,(ON_Object **)&local_198);
              bVar11 = iVar16 != 0;
              if ((ON_Object *)local_198.m_min.x != (ON_Object *)0x0) {
                pOVar17 = ON_Mesh::Cast((ON_Object *)local_198.m_min.x);
                if (pOVar17 == (ON_Mesh *)0x0) {
                  if ((ON_Object *)local_198.m_min.x != (ON_Object *)0x0) {
                    (*(*(_func_int ***)local_198.m_min.x)[4])();
                  }
                }
                else {
                  ON_BrepFace::SetMesh
                            ((ON_BrepFace *)
                             ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                             lVar23 + -0x5c),render_mesh,pOVar17);
                }
              }
            }
            if (bVar11 == false) break;
            lVar23 = lVar23 + 0xd8;
            bVar25 = uVar22 < uVar15;
            uVar22 = uVar22 + 1;
          } while (bVar25);
        }
      }
      bVar25 = ON_BinaryArchive::EndRead3dmChunk(file);
      uVar22 = 0;
      if (bVar25) {
        uVar22 = (ulong)bVar11;
      }
      if ((char)uVar22 == '\x01') {
        local_f8.m_min.x = (double)((ulong)local_f8.m_min.x & 0xffffffff00000000);
        local_168.m_min.x = 0.0;
        bVar11 = ON_BinaryArchive::BeginRead3dmBigChunk
                           (file,(uint *)&local_f8,(ON__INT64 *)&local_168);
        if (!bVar11) goto LAB_00406010;
        bVar11 = false;
        if (local_f8.m_min.x._0_4_ == 0x40008000) {
          if ((int)uVar15 < 1) {
            bVar11 = true;
          }
          else {
            lVar23 = 0;
            uVar22 = 1;
            do {
              bVar11 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_128);
              if ((bVar11) && (local_128.m_min.x._0_1_ != '\0')) {
                iVar16 = ON_BinaryArchive::ReadObject(file,(ON_Object **)&local_198);
                bVar11 = iVar16 != 0;
                if ((ON_Object *)local_198.m_min.x != (ON_Object *)0x0) {
                  pOVar17 = ON_Mesh::Cast((ON_Object *)local_198.m_min.x);
                  if (pOVar17 == (ON_Mesh *)0x0) {
                    if ((ON_Object *)local_198.m_min.x != (ON_Object *)0x0) {
                      (*(*(_func_int ***)local_198.m_min.x)[4])();
                    }
                  }
                  else {
                    ON_BrepFace::SetMesh
                              ((ON_BrepFace *)
                               ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                  super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                               lVar23 + -0x5c),analysis_mesh,pOVar17);
                  }
                }
              }
              if (bVar11 == false) break;
              lVar23 = lVar23 + 0xd8;
              bVar25 = uVar22 < uVar15;
              uVar22 = uVar22 + 1;
            } while (bVar25);
          }
        }
        bVar25 = ON_BinaryArchive::EndRead3dmChunk(file);
        uVar22 = 0;
        if (bVar25) {
          uVar22 = (ulong)bVar11;
        }
      }
    }
    else {
LAB_00406010:
      uVar22 = 0;
    }
  }
  if (((char)uVar22 == '\0') || (local_1cc < 2)) goto LAB_004060f8;
  bVar11 = ON_BinaryArchive::ReadInt(file,&this->m_is_solid);
  uVar22 = CONCAT71(extraout_var_02,bVar11) & 0xffffffff;
  if (2 < (uint)this->m_is_solid) {
    this->m_is_solid = 0;
  }
  if (((char)uVar22 == '\0') || (local_1cc < 3)) goto LAB_004060f8;
  local_198.m_min.x = (double)((ulong)local_198.m_min.x & 0xffffffff00000000);
  bVar25 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(file,(int *)&local_198);
  if (!bVar25) {
    uVar22 = 0;
    goto LAB_004060f8;
  }
  if (local_198.m_min.x._0_4_ < 1) {
    bVar25 = true;
  }
  else {
    local_168.m_min.x = (double)((ulong)local_168.m_min.x & 0xffffffffffffff00);
    bVar12 = ON_BinaryArchive::ReadBool(file,(bool *)&local_168);
    bVar25 = true;
    if (bVar12) {
      if (local_168.m_min.x._0_1_ == '\x01') {
        pOVar18 = (ON_BrepRegionTopology *)operator_new(0x38);
        ON_BrepRegionTopology::ON_BrepRegionTopology(pOVar18);
        this->m_region_topology = pOVar18;
        bVar12 = ON_BrepRegionTopology::Read(pOVar18,file);
        if (!bVar12) {
          pOVar18 = this->m_region_topology;
          if (pOVar18 != (ON_BrepRegionTopology *)0x0) {
            ON_BrepRegionTopology::~ON_BrepRegionTopology(pOVar18);
          }
          operator_delete(pOVar18,0x38);
          this->m_region_topology = (ON_BrepRegionTopology *)0x0;
          goto LAB_004060de;
        }
      }
      bVar25 = false;
    }
  }
LAB_004060de:
  bVar12 = ON_BinaryArchive::EndRead3dmChunk(file);
  uVar22 = (ulong)bVar11;
  if (!bVar12) {
    uVar22 = 0;
  }
  if (bVar25) {
    uVar22 = 0;
  }
LAB_004060f8:
  uVar15 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
  if (uVar15 < 0x1317f0a) {
    this->m_is_solid = 0;
  }
  iVar16 = ON_BinaryArchive::Archive3dmVersion(file);
  if (iVar16 < 0x5a) {
    pOVar19 = &this->m_bbox;
    bVar11 = ON_BoundingBox::IsNotEmpty(pOVar19);
    if (bVar11) {
      local_1c0 = (double)CONCAT44(local_1c0._4_4_,(int)uVar22);
      local_98 = (pOVar19->m_min).x;
      dStack_90 = (this->m_bbox).m_min.y;
      local_88 = (this->m_bbox).m_min.z;
      dStack_80 = (this->m_bbox).m_max.x;
      local_78 = (this->m_bbox).m_max.y;
      dStack_70 = (this->m_bbox).m_max.z;
      local_f8.m_max.y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
      local_f8.m_max.z = ON_BoundingBox::EmptyBoundingBox.m_max.z;
      local_f8.m_min.z = ON_BoundingBox::EmptyBoundingBox.m_min.z;
      local_f8.m_max.x = ON_BoundingBox::EmptyBoundingBox.m_max.x;
      local_f8.m_min.x = ON_BoundingBox::EmptyBoundingBox.m_min.x;
      local_f8.m_min.y = ON_BoundingBox::EmptyBoundingBox.m_min.y;
      uVar22 = (ulong)(uint)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                            super_ON_ClassArray<ON_BrepFace>.m_count;
      local_1c8 = pOVar19;
      if (uVar22 != 0) {
        lVar23 = 0;
        do {
          pOVar5 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                   m_a;
          pdVar1 = (double *)
                   ((long)&(((ON_BoundingBox *)((ON_Color *)(&pOVar5->m_face_uuid + 1) + 1))->m_min)
                           .x + lVar23);
          local_c8 = *pdVar1;
          dStack_c0 = pdVar1[1];
          local_b8 = *(double *)((long)(&pOVar5->m_face_uuid + 2) + lVar23 + 4);
          dStack_b0 = ((double *)((long)(&pOVar5->m_face_uuid + 2) + lVar23 + 4))[1];
          local_a8 = *(double *)((long)(&pOVar5->m_face_uuid + 3) + lVar23 + 4);
          dStack_a0 = ((double *)((long)(&pOVar5->m_face_uuid + 3) + lVar23 + 4))[1];
          ON_BrepFace::InternalFaceBoundingBox
                    (&local_128,(ON_BrepFace *)((pOVar5->m_face_uuid).Data4 + lVar23 + -0x5c),false,
                     false);
          local_198.m_max.y = local_128.m_max.y;
          local_198.m_max.z = local_128.m_max.z;
          local_198.m_min.z = local_128.m_min.z;
          local_198.m_max.x = local_128.m_max.x;
          local_198.m_min.x = local_128.m_min.x;
          local_198.m_min.y = local_128.m_min.y;
          local_168.m_max.y = local_a8;
          local_168.m_max.z = dStack_a0;
          local_168.m_min.z = local_b8;
          local_168.m_max.x = dStack_b0;
          local_168.m_min.x = local_c8;
          local_168.m_min.y = dStack_c0;
          bVar11 = ON_BoundingBox::IsNotEmpty(&local_198);
          pOVar19 = &local_168;
          if ((bVar11) &&
             (bVar11 = ON_BoundingBox::IsValid(&local_168), pOVar19 = &local_198, bVar11)) {
            ON_BoundingBox::Includes(&local_168,&local_198,false);
          }
          pOVar20 = (ON_BoundingBox *)
                    ((long)&(((ON_BoundingBox *)((ON_Color *)(&pOVar5->m_face_uuid + 1) + 1))->m_min
                            ).x + lVar23);
          local_68 = (pOVar19->m_min).x;
          dStack_60 = (pOVar19->m_min).y;
          local_58 = (pOVar19->m_min).z;
          dStack_50 = (pOVar19->m_max).x;
          local_48 = (pOVar19->m_max).y;
          dStack_40 = (pOVar19->m_max).z;
          *(double *)((long)(&pOVar5->m_face_uuid + 3) + lVar23 + 4) = local_48;
          *(double *)((long)(&pOVar5->m_face_uuid + 3) + lVar23 + 0xc) = dStack_40;
          *(double *)((long)(&pOVar5->m_face_uuid + 2) + lVar23 + 4) = local_58;
          *(double *)((long)(&pOVar5->m_face_uuid + 2) + lVar23 + 0xc) = dStack_50;
          (pOVar20->m_min).x = local_68;
          *(double *)((long)((ON_Color *)(&pOVar5->m_face_uuid + 1) + 3) + lVar23) = dStack_60;
          ON_BoundingBox::Union(&local_f8,pOVar20);
          lVar23 = lVar23 + 0xd8;
        } while (uVar22 * 0xd8 - lVar23 != 0);
      }
      pOVar19 = &local_198;
      local_198.m_max.y = local_f8.m_max.y;
      local_198.m_max.z = local_f8.m_max.z;
      local_198.m_min.z = local_f8.m_min.z;
      local_198.m_max.x = local_f8.m_max.x;
      local_198.m_min.x = local_f8.m_min.x;
      local_198.m_min.y = local_f8.m_min.y;
      local_168.m_max.y = local_78;
      local_168.m_max.z = dStack_70;
      local_168.m_min.z = local_88;
      local_168.m_max.x = dStack_80;
      local_168.m_min.x = local_98;
      local_168.m_min.y = dStack_90;
      bVar11 = ON_BoundingBox::IsNotEmpty(pOVar19);
      if (bVar11) {
        bVar11 = ON_BoundingBox::IsValid(&local_168);
        pOVar20 = local_1c8;
        uVar22 = (ulong)local_1c0 & 0xffffffff;
        local_1c8 = pOVar20;
        if (bVar11) {
          pOVar19 = &local_198;
          ON_BoundingBox::Includes(&local_168,pOVar19,false);
          local_1c8 = pOVar20;
        }
      }
      else {
        pOVar19 = &local_168;
        uVar22 = (ulong)local_1c0 & 0xffffffff;
      }
      dVar27 = (pOVar19->m_min).x;
      dVar6 = (pOVar19->m_min).y;
      dVar7 = (pOVar19->m_min).z;
      dVar8 = (pOVar19->m_max).x;
      dVar9 = (pOVar19->m_max).z;
      (local_1c8->m_max).y = (pOVar19->m_max).y;
      (local_1c8->m_max).z = dVar9;
      (local_1c8->m_min).z = dVar7;
      (local_1c8->m_max).x = dVar8;
      (local_1c8->m_min).x = dVar27;
      (local_1c8->m_min).y = dVar6;
    }
  }
  return SUB81(uVar22,0);
}

Assistant:

bool ON_Brep::Read( ON_BinaryArchive& file )
{
  int i;
  int C2_count = 0;
  int C3_count = 0;
  int S_count = 0;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion( &major_version, &minor_version );
  if ( rc && major_version == 2 ) 
  {
    rc = ReadOld200(file,minor_version); // legacy trimmed face
  }
  else if ( rc && major_version == 3 ) 
  {
    // 2d curves
    if (rc) 
      rc = m_C2.Read(file);
    C2_count = m_C2.Count();

    // 3d curves
    if (rc) 
      rc = m_C3.Read(file);
    C3_count = m_C3.Count();

    // untrimmed surfaces
    if (rc) 
      rc = m_S.Read(file);
    S_count = m_S.Count();

    // vertices
    if (rc) 
      rc = m_V.Read(file);

    // edges
    if (rc) 
    {
      rc = m_E.Read(file);
      if (rc) {
        for ( i = 0; i < m_E.Count(); i++ ) {
          ON_BrepEdge& e = m_E[i];
          e.m_brep = this;
          if ( e.m_c3i >= 0 && e.m_c3i < C3_count )
          {
            bool bProxyCurveIsReversed = e.ProxyCurveIsReversed();
            ON_Interval pdom = e.ProxyCurveDomain();
            ON_Interval edom = e.Domain();
            e.SetProxyCurve( m_C3[e.m_c3i], pdom );
            if ( bProxyCurveIsReversed )
              e.ON_CurveProxy::Reverse();
            e.SetDomain(edom);
          }
        }
      }
    }

    // trims
    if (rc) 
    {
      rc = m_T.Read(file);
      if (rc) {
        for ( i = 0; i < m_T.Count(); i++ ) {
          ON_BrepTrim& trim = m_T[i];
          trim.m_brep = this;
          if ( trim.m_c2i >= 0 && trim.m_c2i < C2_count )
          {
            bool bProxyCurveIsReversed = trim.ProxyCurveIsReversed();
            ON_Interval pdom = trim.ProxyCurveDomain();
            ON_Interval tdom = trim.Domain();
            trim.SetProxyCurve( m_C2[trim.m_c2i], pdom );
            if ( bProxyCurveIsReversed )
              trim.ON_CurveProxy::Reverse();
            trim.SetDomain(tdom);
          }
        }
      }
    }

    // loops
    if (rc) 
    {
      rc = m_L.Read(file);
      if ( rc )
      {
        for ( i = 0; i < m_L.Count(); i++ ) 
        {
          m_L[i].m_brep = this;
        }
      }
    }

    // faces
    if (rc) 
    {
      rc = m_F.Read(file);
      if (rc) {
        for ( i = 0; i < m_F.Count(); i++ ) {
          ON_BrepFace& f = m_F[i];
          f.m_brep = this;
          if ( f.m_si >= 0 && f.m_si < S_count )
            f.SetProxySurface(m_S[f.m_si]);
        }
      }
    }

    // bounding box
    if (rc) 
      rc = file.ReadPoint( m_bbox.m_min );
    if (rc) 
      rc = file.ReadPoint( m_bbox.m_max );

    // fill in missing information
    ReadFillInMissingBoxes(*this);

    // end of chunk version 3.0

    if (rc && minor_version >= 1 )
    {
      // added for chunk version 3.1

      ON_Object* obj;
      ON__UINT32 tcode = 0;
      ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
      int fi;
      unsigned char b;

      const int face_count = m_F.Count();

      // read render meshes
      tcode = 0;
      length_TCODE_ANONYMOUS_CHUNK = 0;
      rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
      if ( rc )
      {
        if ( tcode != TCODE_ANONYMOUS_CHUNK )
          rc = false;
        else
        {
          for ( fi = 0; rc && fi < face_count; fi++ ) 
          {
            rc = file.ReadChar(&b);
            if (rc && b) 
            {
              obj = 0;
              rc = file.ReadObject(&obj);
              if ( 0 != obj )
              {
                auto pMesh = ON_Mesh::Cast(obj);
                if (nullptr == pMesh)
                {
                  delete obj;
                }
                else
                {
                  m_F[fi].SetMesh(ON::render_mesh, pMesh);
                }
              }
            }
          }
        }
        if ( !file.EndRead3dmChunk() )
          rc = false;
      }

      if (rc)
      {
        // read analysis meshes
        tcode = 0;
        length_TCODE_ANONYMOUS_CHUNK = 0;
        rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
        if ( rc )
        {
          if ( tcode != TCODE_ANONYMOUS_CHUNK )
            rc = false;
          else
          {
            for ( fi = 0; rc && fi < face_count; fi++ ) 
            {
              rc = file.ReadChar(&b);
              if (rc && b) 
              {
                rc = file.ReadObject(&obj);
                
                if (nullptr != obj)
                {
                  auto pMesh = ON_Mesh::Cast(obj);
                  if (nullptr == pMesh)
                  {
                    delete obj;
                  }
                  else
                  {
                    m_F[fi].SetMesh(ON::analysis_mesh, pMesh);
                  }
                }
              }
            }
          }
          if ( !file.EndRead3dmChunk() )
            rc = false;
        }
      }
    }

    if ( rc && minor_version >= 2 )
    {
      rc =  file.ReadInt( &m_is_solid );
      if ( m_is_solid < 0 || m_is_solid >= 3 )
        m_is_solid = 0;
      if (rc && minor_version >= 3)
      {
        // begin chunk verson 3.3

        // region topology chunk added
        int region_topology_chunk_version = 0;
        if (!file.BeginRead3dmAnonymousChunk(&region_topology_chunk_version))
          rc = false;
        else
        {
          bool rc1 = false;
          for (;;)
          {
            if (region_topology_chunk_version < 1)
              break;

            bool bReadRegionTopology = false;
            if (!file.ReadBool(&bReadRegionTopology))
              break;

            if (bReadRegionTopology)
            {
              m_region_topology = new ON_BrepRegionTopology();
              if (!m_region_topology->Read(file))
              {
                delete m_region_topology;
                m_region_topology = nullptr;
                break;
              }
            }
            rc1 = true;
            break;
          }
          if (!file.EndRead3dmChunk())
            rc1 = false;
          if (false == rc1)
            rc = false;
        }
      }
    }
  }

  if ( file.ArchiveOpenNURBSVersion() < 20021002 )
  {
    m_is_solid = 0;
  }

  // GBA 3-Sept-20 RH-60112
  // In V6 and earlier bounding boxes of faces were bounding box of underlying surface.
  // This can result in enourmous boxes which mess up make2d
  // In V7 bounding boxes use the trim pbox resulting in resonable boxes.
  ////if (file.Archive3dmVersion() < 70 || file.ArchiveOpenNURBSVersion() < 2382395020)
  ////{
  ////  if (!m_bbox.IsEmpty())
  ////  {
  ////    ON_BoundingBox orig_box = m_bbox;
  ////    ClearBoundingBox();
  ////    BoundingBox();                    // compute bounding box
  ////    m_bbox.Intersection(orig_box);
  ////  }
  ////}

  // Dale Lear https://mcneel.myjetbrains.com/youtrack/issue/RH-64277
  // The test used to fix RH-60112 was not adequate and now the set of
  // active v7 3dm files has lots of cases with breps that have
  // oversized bounding boxes by the new standard avter Greg's RH-60112 changes.
  // We have already started writing V8 files and those versions of V8
  // have been used by some of our Discourse early adopters.
  // At this point, I'm going to assume a bounding box read from a V7 or V8 file
  // can be too big. By the time V9 rolls around, the boxes should be cleaned up.
  if (file.Archive3dmVersion() < 90 && m_bbox.IsNotEmpty() )
  {
    const ON_BoundingBox archive_brep_bbox = m_bbox;
    ON_BoundingBox new_brep_bbox = ON_BoundingBox::EmptyBoundingBox;
    const unsigned int face_count = m_F.UnsignedCount();
    for (unsigned fi = 0; fi < face_count; ++fi)
    {
      ON_BrepFace& f = this->m_F[fi];
      const ON_BoundingBox archive_face_bbox = f.m_bbox;
      ON_BoundingBox new_face_bbox = f.InternalFaceBoundingBox(false, false);
      f.m_bbox = Internal_BestBoundingBox(archive_face_bbox, new_face_bbox);
      new_brep_bbox.Union(f.m_bbox);
    }
    m_bbox = Internal_BestBoundingBox(archive_brep_bbox, new_brep_bbox);
  }

  return rc;
}